

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O1

string * __thiscall
DataRefs::GetDebugAcFilter_abi_cxx11_(string *__return_storage_ptr__,DataRefs *this)

{
  size_t sVar1;
  char key [10];
  char local_1a [10];
  
  if (this->uDebugAcFilter == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    snprintf(local_1a,10,"%06X");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(local_1a);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_1a,local_1a + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DataRefs::GetDebugAcFilter() const
{
    char key[10];
    if ( !uDebugAcFilter ) return std::string();
    
    // convert to hex representation
    snprintf(key,sizeof(key),"%06X",uDebugAcFilter);
    return key;
}